

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.cpp
# Opt level: O0

Table * __thiscall Heuristics::popFromFrontierDFS(Table *__return_storage_ptr__,Heuristics *this)

{
  int iVar1;
  reference pvVar2;
  Table *table;
  Heuristics *this_local;
  
  pvVar2 = std::stack<Table,_std::deque<Table,_std::allocator<Table>_>_>::top(&this->frontier);
  *(undefined8 *)__return_storage_ptr__->table = *(undefined8 *)pvVar2->table;
  *(undefined8 *)(__return_storage_ptr__->table[2] + 2) = *(undefined8 *)(pvVar2->table[2] + 2);
  iVar1 = pvVar2->evaluationScore;
  __return_storage_ptr__->current_col = pvVar2->current_col;
  __return_storage_ptr__->evaluationScore = iVar1;
  std::stack<Table,_std::deque<Table,_std::allocator<Table>_>_>::pop(&this->frontier);
  return __return_storage_ptr__;
}

Assistant:

Table Heuristics::popFromFrontierDFS() {
    Table table = this->frontier.top();
    frontier.pop();
    return table;
}